

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall
efsw::DirectorySnapshot::deleteAll(DirectorySnapshot *this,DirectorySnapshotDiff *Diff)

{
  bool bVar1;
  _Base_ptr p_Var2;
  DirectorySnapshotDiff *this_00;
  _Self __tmp;
  FileInfo fi;
  FileInfo local_70;
  
  FileInfo::FileInfo(&local_70);
  for (p_Var2 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Files)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    FileInfo::operator=(&local_70,(FileInfo *)(p_Var2 + 2));
    bVar1 = FileInfo::isDirectory(&local_70);
    this_00 = Diff;
    if (bVar1) {
      this_00 = (DirectorySnapshotDiff *)&Diff->DirsDeleted;
    }
    std::__cxx11::list<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::push_back
              (&this_00->FilesDeleted,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void DirectorySnapshot::deleteAll( DirectorySnapshotDiff& Diff )
{
	FileInfo fi;

	for ( FileInfoMap::iterator it = Files.begin(); it != Files.end(); it++ )
	{
		fi = it->second;

		if ( fi.isDirectory() )
		{
			Diff.DirsDeleted.push_back( fi );
		}
		else
		{
			Diff.FilesDeleted.push_back( fi );
		}
	}
}